

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btMultiBodySolverConstraint>::resize
          (btAlignedObjectArray<btMultiBodySolverConstraint> *this,int newsize,
          btMultiBodySolverConstraint *fillData)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = *(int *)(this + 4);
  lVar3 = (long)iVar1;
  if (iVar1 <= newsize) {
    if (iVar1 < newsize) {
      reserve(this,newsize);
    }
    lVar2 = lVar3 * 0xe0;
    for (; lVar3 < newsize; lVar3 = lVar3 + 1) {
      memcpy((void *)(*(long *)(this + 0x10) + lVar2),fillData,0xe0);
      lVar2 = lVar2 + 0xe0;
    }
  }
  *(int *)(this + 4) = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}